

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs_active.cc
# Opt level: O3

base_learner * cs_active_setup(options_i *options,vw *all)

{
  uint32_t *location;
  vw_ostream *pvVar1;
  _func_int **pp_Var2;
  options_i *poVar3;
  float *pfVar4;
  vw *all_00;
  int iVar5;
  cs_active *pcVar6;
  option_group_definition *poVar7;
  typed_option<int> *op;
  typed_option<float> *ptVar8;
  _func_int ***__dest;
  typed_option<unsigned_long> *ptVar9;
  base_learner *pbVar10;
  learner<char,_example> *base;
  learner<cs_active,_example> *plVar11;
  vw_exception *pvVar12;
  long lVar13;
  code *predict;
  code *learn;
  uint uVar14;
  undefined **ppuVar15;
  label_parser *plVar16;
  byte bVar17;
  bool simulation;
  int domination;
  size_type __dnew_11;
  option_group_definition new_options;
  size_type __dnew;
  string loss_function_type;
  size_type __dnew_10;
  size_type __dnew_2;
  size_type __dnew_9;
  size_type __dnew_8;
  size_type __dnew_7;
  size_type __dnew_6;
  size_type __dnew_5;
  size_type __dnew_4;
  size_type __dnew_3;
  bool local_be9;
  options_i *local_be8;
  cs_active *local_be0;
  int local_bd4;
  _func_int ***local_bd0;
  _func_int **local_bc8;
  _func_int **local_bc0 [2];
  float *local_bb0;
  float *local_ba8;
  vw *local_ba0;
  long local_b98;
  _func_int ***local_b90;
  _func_int **local_b88;
  _func_int **local_b80 [2];
  _func_int ***local_b70;
  _func_int **local_b68;
  _func_int **local_b60 [2];
  _func_int ***local_b50;
  _func_int **local_b48;
  _func_int **local_b40 [2];
  _func_int ***local_b30;
  _func_int **local_b28;
  _func_int **local_b20 [2];
  _func_int ***local_b10;
  _func_int **local_b08;
  _func_int **local_b00 [2];
  _func_int ***local_af0;
  _func_int **local_ae8;
  _func_int **local_ae0 [2];
  _func_int ***local_ad0;
  _func_int **local_ac8;
  _func_int **local_ac0 [2];
  _func_int ***local_ab0;
  _func_int **local_aa8;
  _func_int **local_aa0 [2];
  _func_int ***local_a90;
  _func_int **local_a88;
  _func_int **local_a80 [2];
  _func_int ***local_a70;
  _func_int **local_a68;
  _func_int **local_a60 [2];
  option_group_definition local_a50;
  string local_a18;
  string local_9f8;
  string local_9d8;
  string local_9b8;
  string local_998;
  string local_978;
  string local_958;
  string local_938;
  string local_918;
  long *local_8f8;
  long local_8f0;
  long local_8e8 [2];
  undefined1 local_8d8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_8c0;
  string local_8a8 [64];
  bool local_868;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_850;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_840;
  string local_750;
  string local_730;
  string local_710;
  string local_6f0;
  string local_6d0;
  string local_6b0;
  string local_690;
  undefined1 local_670 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_5e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_5d8;
  undefined1 local_5d0 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_548;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_538;
  undefined1 local_530 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_4a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_498;
  typed_option<float> local_490;
  typed_option<float> local_3f0;
  typed_option<unsigned_long> local_350;
  typed_option<unsigned_long> local_2b0;
  typed_option<float> local_210;
  typed_option<float> local_170;
  typed_option<int> local_d0;
  
  bVar17 = 0;
  local_ba0 = all;
  pcVar6 = calloc_or_throw<cs_active>(1);
  memset(pcVar6,0,0xa8);
  local_be9 = false;
  local_8d8._0_8_ = (_func_int **)0x1e;
  local_be0 = pcVar6;
  local_bd0 = local_bc0;
  local_bd0 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_bd0,(ulong)local_8d8);
  local_bc0[0] = (_func_int **)local_8d8._0_8_;
  builtin_strncpy((char *)((long)local_bd0 + 0xe)," Active ",8);
  builtin_strncpy((char *)((long)local_bd0 + 0x16),"Learning",8);
  *(undefined4 *)local_bd0 = 0x74736f43;
  builtin_strncpy((char *)((long)local_bd0 + 4),"-sen",4);
  *(undefined4 *)(local_bd0 + 1) = 0x69746973;
  builtin_strncpy((char *)((long)local_bd0 + 0xc),"ve A",4);
  local_bc8 = (_func_int **)local_8d8._0_8_;
  *(char *)((long)local_bd0 + local_8d8._0_8_) = '\0';
  local_a50.m_name._M_dataplus._M_p = (pointer)&local_a50.m_name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a50,local_bd0,(char *)(local_8d8._0_8_ + (long)local_bd0));
  local_a50.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a50.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a50.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_bd0 != local_bc0) {
    operator_delete(local_bd0);
  }
  local_918._M_dataplus._M_p = (pointer)&local_918.field_2;
  local_918.field_2._M_allocated_capacity = 0x76697463615f7363;
  local_918.field_2._8_2_ = 0x65;
  local_918._M_string_length = 9;
  location = &pcVar6->num_classes;
  VW::config::typed_option<unsigned_int>::typed_option
            ((typed_option<unsigned_int> *)local_8d8,&local_918,location);
  local_868 = true;
  local_a70 = local_a60;
  local_670._0_8_ = (_func_int **)0x2d;
  local_a70 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_a70,(ulong)local_670);
  local_a60[0] = (_func_int **)local_670._0_8_;
  builtin_strncpy((char *)((long)local_a70 + 0x1d),"g with <",8);
  builtin_strncpy((char *)((long)local_a70 + 0x25),"k> costs",8);
  local_a70[2] = (_func_int **)0x656c206576697463;
  local_a70[3] = (_func_int **)0x7720676e696e7261;
  *local_a70 = (_func_int **)0x6e65732d74736f43;
  local_a70[1] = (_func_int **)0x6120657669746973;
  local_a68 = (_func_int **)local_670._0_8_;
  *(char *)((long)local_a70 + local_670._0_8_) = '\0';
  std::__cxx11::string::_M_assign(local_8a8);
  poVar7 = VW::config::option_group_definition::add<VW::config::typed_option<unsigned_int>&>
                     (&local_a50,(typed_option<unsigned_int> *)local_8d8);
  local_938._M_dataplus._M_p = (pointer)&local_938.field_2;
  local_938.field_2._M_allocated_capacity = 0x6974616c756d6973;
  local_938.field_2._8_2_ = 0x6e6f;
  local_938._M_string_length = 10;
  local_938.field_2._M_local_buf[10] = '\0';
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_670,&local_938,&local_be9);
  local_a90 = local_a80;
  local_530._0_8_ = (_func_int **)0x2e;
  local_a90 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_a90,(ulong)local_530);
  local_a80[0] = (_func_int **)local_530._0_8_;
  builtin_strncpy((char *)((long)local_a90 + 0x1e)," simulat",8);
  builtin_strncpy((char *)((long)local_a90 + 0x26),"ion mode",8);
  local_a90[2] = (_func_int **)0x656c206576697463;
  local_a90[3] = (_func_int **)0x7320676e696e7261;
  *local_a90 = (_func_int **)0x6e65732d74736f63;
  local_a90[1] = (_func_int **)0x6120657669746973;
  local_a88 = (_func_int **)local_530._0_8_;
  *(char *)((long)local_a90 + local_530._0_8_) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_670 + 0x30));
  poVar7 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (poVar7,(typed_option<bool> *)local_670);
  local_958._M_dataplus._M_p = (pointer)&local_958.field_2;
  local_958.field_2._M_allocated_capacity = 0x656e696c65736162;
  local_958._M_string_length = 8;
  local_958.field_2._M_local_buf[8] = '\0';
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_530,&local_958,&pcVar6->is_baseline);
  local_ab0 = local_aa0;
  local_d0.super_base_option._vptr_base_option = (_func_int **)0x27;
  local_ab0 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_ab0,(ulong)&local_d0);
  local_aa0[0] = local_d0.super_base_option._vptr_base_option;
  local_ab0[2] = (_func_int **)0x656c206576697463;
  local_ab0[3] = (_func_int **)0x6220676e696e7261;
  *local_ab0 = (_func_int **)0x6e65732d74736f63;
  local_ab0[1] = (_func_int **)0x6120657669746973;
  builtin_strncpy((char *)((long)local_ab0 + 0x1f),"baseline",8);
  local_aa8 = local_d0.super_base_option._vptr_base_option;
  *(char *)((long)local_ab0 + (long)local_d0.super_base_option._vptr_base_option) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_530 + 0x30));
  poVar7 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (poVar7,(typed_option<bool> *)local_530);
  local_978._M_dataplus._M_p = (pointer)&local_978.field_2;
  local_978.field_2._M_allocated_capacity = 0x6974616e696d6f64;
  local_978.field_2._8_2_ = 0x6e6f;
  local_978._M_string_length = 10;
  local_978.field_2._M_local_buf[10] = '\0';
  VW::config::typed_option<int>::typed_option(&local_d0,&local_978,&local_bd4);
  op = VW::config::typed_option<int>::default_value(&local_d0,1);
  local_ad0 = local_ac0;
  local_170.super_base_option._vptr_base_option = (_func_int **)0x38;
  local_ad0 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_ad0,(ulong)&local_170);
  local_ac0[0] = local_170.super_base_option._vptr_base_option;
  local_ad0[4] = (_func_int **)0x6e696d6f64206573;
  local_ad0[5] = (_func_int **)0x44202e6e6f697461;
  local_ad0[2] = (_func_int **)0x656c206576697463;
  local_ad0[3] = (_func_int **)0x7520676e696e7261;
  *local_ad0 = (_func_int **)0x6e65732d74736f63;
  local_ad0[1] = (_func_int **)0x6120657669746973;
  local_ad0[6] = (_func_int **)0x3120746c75616665;
  local_ac8 = local_170.super_base_option._vptr_base_option;
  *(char *)((long)local_ad0 + (long)local_170.super_base_option._vptr_base_option) = '\0';
  std::__cxx11::string::_M_assign((string *)&(op->super_base_option).m_help);
  poVar7 = VW::config::option_group_definition::add<VW::config::typed_option<int>&>(poVar7,op);
  local_998._M_dataplus._M_p = (pointer)&local_998.field_2;
  local_998.field_2._M_allocated_capacity = 0x656e776f6c6c656d;
  local_998.field_2._8_2_ = 0x7373;
  local_998._M_string_length = 10;
  local_998.field_2._M_local_buf[10] = '\0';
  VW::config::typed_option<float>::typed_option(&local_170,&local_998,&pcVar6->c0);
  ptVar8 = VW::config::typed_option<float>::default_value(&local_170,0.1);
  local_af0 = local_ae0;
  local_210.super_base_option._vptr_base_option = (_func_int **)0x26;
  local_af0 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_af0,(ulong)&local_210);
  local_ae0[0] = local_210.super_base_option._vptr_base_option;
  local_af0[2] = (_func_int **)0x305f632072657465;
  local_af0[3] = (_func_int **)0x6c7561666544202e;
  *local_af0 = (_func_int **)0x656e776f6c6c656d;
  local_af0[1] = (_func_int **)0x6d61726170207373;
  builtin_strncpy((char *)((long)local_af0 + 0x1e),"ult 0.1.",8);
  local_ae8 = local_210.super_base_option._vptr_base_option;
  *(char *)((long)local_af0 + (long)local_210.super_base_option._vptr_base_option) = '\0';
  std::__cxx11::string::_M_assign((string *)&(ptVar8->super_base_option).m_help);
  poVar7 = VW::config::option_group_definition::add<VW::config::typed_option<float>&>(poVar7,ptVar8)
  ;
  local_9b8._M_dataplus._M_p = (pointer)&local_9b8.field_2;
  local_9b8.field_2._M_allocated_capacity._0_4_ = 0x676e6172;
  local_9b8.field_2._M_allocated_capacity._4_3_ = 0x635f65;
  local_9b8._M_string_length = 7;
  local_9b8.field_2._M_local_buf[7] = '\0';
  VW::config::typed_option<float>::typed_option(&local_210,&local_9b8,&pcVar6->c1);
  ptVar8 = VW::config::typed_option<float>::default_value(&local_210,0.5);
  local_b10 = local_b00;
  local_2b0.super_base_option._vptr_base_option = (_func_int **)0x50;
  local_be8 = options;
  __dest = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_b10,(ulong)&local_2b0);
  pp_Var2 = local_2b0.super_base_option._vptr_base_option;
  local_b00[0] = local_2b0.super_base_option._vptr_base_option;
  local_b10 = __dest;
  memcpy(__dest,"parameter controlling the threshold for per-label cost uncertainty. Default 0.5.",
         0x50);
  local_b08 = pp_Var2;
  *(undefined1 *)((long)__dest + (long)pp_Var2) = 0;
  std::__cxx11::string::_M_assign((string *)&(ptVar8->super_base_option).m_help);
  poVar7 = VW::config::option_group_definition::add<VW::config::typed_option<float>&>(poVar7,ptVar8)
  ;
  pcVar6 = local_be0;
  local_9d8._M_dataplus._M_p = (pointer)&local_9d8.field_2;
  local_9d8.field_2._M_allocated_capacity = 0x6562616c5f78616d;
  local_9d8.field_2._8_2_ = 0x736c;
  local_9d8._M_string_length = 10;
  local_9d8.field_2._M_local_buf[10] = '\0';
  VW::config::typed_option<unsigned_long>::typed_option
            (&local_2b0,&local_9d8,&local_be0->max_labels);
  ptVar9 = VW::config::typed_option<unsigned_long>::default_value(&local_2b0,0xffffffffffffffff);
  local_b30 = local_b20;
  local_350.super_base_option._vptr_base_option = (_func_int **)0x20;
  local_b30 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_b30,(ulong)&local_350);
  local_b20[0] = local_350.super_base_option._vptr_base_option;
  local_b30[2] = (_func_int **)0x206c6562616c2066;
  local_b30[3] = (_func_int **)0x2e73656972657571;
  *local_b30 = (_func_int **)0x206d756d6978616d;
  local_b30[1] = (_func_int **)0x6f207265626d756e;
  local_b28 = local_350.super_base_option._vptr_base_option;
  *(char *)((long)local_b30 + (long)local_350.super_base_option._vptr_base_option) = '\0';
  std::__cxx11::string::_M_assign((string *)&(ptVar9->super_base_option).m_help);
  poVar7 = VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
                     (poVar7,ptVar9);
  local_9f8._M_dataplus._M_p = (pointer)&local_9f8.field_2;
  local_9f8.field_2._M_allocated_capacity = 0x6562616c5f6e696d;
  local_9f8.field_2._8_2_ = 0x736c;
  local_9f8._M_string_length = 10;
  local_9f8.field_2._M_local_buf[10] = '\0';
  VW::config::typed_option<unsigned_long>::typed_option(&local_350,&local_9f8,&pcVar6->min_labels);
  ptVar9 = VW::config::typed_option<unsigned_long>::default_value(&local_350,0xffffffffffffffff);
  local_b50 = local_b40;
  local_3f0.super_base_option._vptr_base_option = (_func_int **)0x20;
  local_b50 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_b50,(ulong)&local_3f0);
  local_b40[0] = local_3f0.super_base_option._vptr_base_option;
  local_b50[2] = (_func_int **)0x206c6562616c2066;
  local_b50[3] = (_func_int **)0x2e73656972657571;
  *local_b50 = (_func_int **)0x206d756d696e696d;
  local_b50[1] = (_func_int **)0x6f207265626d756e;
  local_b48 = local_3f0.super_base_option._vptr_base_option;
  *(char *)((long)local_b50 + (long)local_3f0.super_base_option._vptr_base_option) = '\0';
  std::__cxx11::string::_M_assign((string *)&(ptVar9->super_base_option).m_help);
  poVar7 = VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
                     (poVar7,ptVar9);
  local_a18._M_dataplus._M_p = (pointer)&local_a18.field_2;
  local_a18.field_2._M_allocated_capacity = 0x78616d5f74736f63;
  local_a18._M_string_length = 8;
  local_a18.field_2._M_local_buf[8] = '\0';
  VW::config::typed_option<float>::typed_option(&local_3f0,&local_a18,&pcVar6->cost_max);
  ptVar8 = VW::config::typed_option<float>::default_value(&local_3f0,1.0);
  local_b70 = local_b60;
  local_490.super_base_option._vptr_base_option = (_func_int **)0x1c;
  local_b70 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_b70,(ulong)&local_490);
  local_b60[0] = local_490.super_base_option._vptr_base_option;
  builtin_strncpy((char *)((long)local_b70 + 0xc),"ound. De",8);
  builtin_strncpy((char *)((long)local_b70 + 0x14),"fault 1.",8);
  *local_b70 = (_func_int **)0x7070752074736f63;
  local_b70[1] = (_func_int **)0x646e756f62207265;
  local_b68 = local_490.super_base_option._vptr_base_option;
  *(char *)((long)local_b70 + (long)local_490.super_base_option._vptr_base_option) = '\0';
  std::__cxx11::string::_M_assign((string *)&(ptVar8->super_base_option).m_help);
  poVar7 = VW::config::option_group_definition::add<VW::config::typed_option<float>&>(poVar7,ptVar8)
  ;
  local_730.field_2._M_allocated_capacity = 0x6e696d5f74736f63;
  local_730._M_string_length = 8;
  local_730.field_2._M_local_buf[8] = '\0';
  local_ba8 = &pcVar6->cost_min;
  local_730._M_dataplus._M_p = (pointer)&local_730.field_2;
  VW::config::typed_option<float>::typed_option(&local_490,&local_730,local_ba8);
  ptVar8 = VW::config::typed_option<float>::default_value(&local_490,0.0);
  local_b90 = local_b80;
  local_5d0._0_8_ = (_func_int **)0x1c;
  local_b90 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_b90,(ulong)local_5d0);
  local_b80[0] = (_func_int **)local_5d0._0_8_;
  builtin_strncpy((char *)((long)local_b90 + 0xc),"ound. De",8);
  builtin_strncpy((char *)((long)local_b90 + 0x14),"fault 0.",8);
  *local_b90 = (_func_int **)0x776f6c2074736f63;
  local_b90[1] = (_func_int **)0x646e756f62207265;
  local_b88 = (_func_int **)local_5d0._0_8_;
  *(char *)((long)local_b90 + local_5d0._0_8_) = '\0';
  std::__cxx11::string::_M_assign((string *)&(ptVar8->super_base_option).m_help);
  poVar7 = VW::config::option_group_definition::add<VW::config::typed_option<float>&>(poVar7,ptVar8)
  ;
  local_750.field_2._M_allocated_capacity = 0x756265645f617363;
  local_750.field_2._8_2_ = 0x67;
  local_750._M_string_length = 9;
  local_bb0 = &pcVar6->cost_max;
  local_750._M_dataplus._M_p = (pointer)&local_750.field_2;
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_5d0,&local_750,&pcVar6->print_debug_stuff);
  local_b98 = 0x1f;
  local_8f8 = local_8e8;
  local_8f8 = (long *)std::__cxx11::string::_M_create((ulong *)&local_8f8,(ulong)&local_b98);
  local_8e8[0] = local_b98;
  builtin_strncpy((char *)((long)local_8f8 + 0xf),"ff for c",8);
  builtin_strncpy((char *)((long)local_8f8 + 0x17),"s_active",8);
  *local_8f8 = 0x656420746e697270;
  local_8f8[1] = 0x6675747320677562;
  local_8f0 = local_b98;
  *(char *)((long)local_8f8 + local_b98) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_5d0 + 0x30));
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (poVar7,(typed_option<bool> *)local_5d0);
  if (local_8f8 != local_8e8) {
    operator_delete(local_8f8);
  }
  local_5d0._0_8_ = &PTR__typed_option_002d9110;
  if (local_538._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_538._M_pi);
  }
  if (local_548._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_548._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_5d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_750._M_dataplus._M_p != &local_750.field_2) {
    operator_delete(local_750._M_dataplus._M_p);
  }
  if (local_b90 != local_b80) {
    operator_delete(local_b90);
  }
  local_490.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d90d8;
  if (local_490.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_490.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_490.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_490.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_490.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_730._M_dataplus._M_p != &local_730.field_2) {
    operator_delete(local_730._M_dataplus._M_p);
  }
  all_00 = local_ba0;
  if (local_b70 != local_b60) {
    operator_delete(local_b70);
  }
  local_3f0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d90d8;
  if (local_3f0.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_3f0.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_3f0.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_3f0.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_3f0.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a18._M_dataplus._M_p != &local_a18.field_2) {
    operator_delete(local_a18._M_dataplus._M_p);
  }
  if (local_b50 != local_b40) {
    operator_delete(local_b50);
  }
  local_350.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d9070;
  if (local_350.m_default_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_350.m_default_value.
               super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_350.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_350.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_350.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9f8._M_dataplus._M_p != &local_9f8.field_2) {
    operator_delete(local_9f8._M_dataplus._M_p);
  }
  if (local_b30 != local_b20) {
    operator_delete(local_b30);
  }
  local_2b0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d9070;
  if (local_2b0.m_default_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2b0.m_default_value.
               super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_2b0.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2b0.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_2b0.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9d8._M_dataplus._M_p != &local_9d8.field_2) {
    operator_delete(local_9d8._M_dataplus._M_p);
  }
  if (local_b10 != local_b00) {
    operator_delete(local_b10);
  }
  local_210.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d90d8;
  if (local_210.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_210.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_210.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_210.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_210.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9b8._M_dataplus._M_p != &local_9b8.field_2) {
    operator_delete(local_9b8._M_dataplus._M_p);
  }
  if (local_af0 != local_ae0) {
    operator_delete(local_af0);
  }
  local_170.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d90d8;
  if (local_170.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_170.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_170.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_998._M_dataplus._M_p != &local_998.field_2) {
    operator_delete(local_998._M_dataplus._M_p);
  }
  if (local_ad0 != local_ac0) {
    operator_delete(local_ad0);
  }
  local_d0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d96b0;
  if (local_d0.m_default_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_default_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_d0.m_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_d0.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_978._M_dataplus._M_p != &local_978.field_2) {
    operator_delete(local_978._M_dataplus._M_p);
  }
  if (local_ab0 != local_aa0) {
    operator_delete(local_ab0);
  }
  local_530._0_8_ = &PTR__typed_option_002d9110;
  if (local_498._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_498._M_pi);
  }
  if (local_4a8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_4a8._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_530);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_958._M_dataplus._M_p != &local_958.field_2) {
    operator_delete(local_958._M_dataplus._M_p);
  }
  if (local_a90 != local_a80) {
    operator_delete(local_a90);
  }
  local_670._0_8_ = &PTR__typed_option_002d9110;
  if (local_5d8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_5d8._M_pi);
  }
  if (local_5e8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_5e8._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_670);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_938._M_dataplus._M_p != &local_938.field_2) {
    operator_delete(local_938._M_dataplus._M_p);
  }
  if (local_a70 != local_a60) {
    operator_delete(local_a70);
  }
  local_8d8._0_8_ = &PTR__typed_option_002d9180;
  if (local_840._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_840._M_pi);
  }
  if (local_850._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_850._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_8d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_918._M_dataplus._M_p != &local_918.field_2) {
    operator_delete(local_918._M_dataplus._M_p);
  }
  poVar3 = local_be8;
  (**local_be8->_vptr_options_i)(local_be8,&local_a50);
  pcVar6->use_domination = true;
  pp_Var2 = (_func_int **)(local_8d8 + 0x10);
  local_8d8._16_8_ = 0x6974616e696d6f64;
  local_8d8._8_8_ = (pointer)0xa;
  local_8c0._M_allocated_capacity._0_3_ = 0x6e6f;
  local_8d8._0_8_ = pp_Var2;
  iVar5 = (*poVar3->_vptr_options_i[1])(poVar3,local_8d8);
  if ((_func_int **)local_8d8._0_8_ != pp_Var2) {
    operator_delete((void *)local_8d8._0_8_);
  }
  if (((byte)iVar5 & local_bd4 == 0) != 0) {
    pcVar6->use_domination = false;
  }
  local_8d8._16_8_ = 0x76697463615f7363;
  local_8c0._M_allocated_capacity._0_2_ = 0x65;
  local_8d8._8_8_ = (pointer)0x9;
  local_8d8._0_8_ = pp_Var2;
  iVar5 = (*local_be8->_vptr_options_i[1])();
  if ((_func_int **)local_8d8._0_8_ != pp_Var2) {
    operator_delete((void *)local_8d8._0_8_);
  }
  if ((char)iVar5 == '\0') {
    plVar11 = (learner<cs_active,_example> *)0x0;
  }
  else {
    pcVar6->all = all_00;
    pcVar6->t = 1;
    (**all_00->loss->_vptr_loss_function)(local_670);
    iVar5 = std::__cxx11::string::compare(local_670);
    if (iVar5 != 0) {
      std::__cxx11::stringstream::stringstream((stringstream *)local_8d8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_8d8 + 0x10),
                 "error: you can\'t use non-squared loss with cs_active",0x34);
      pvVar12 = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (pvVar12,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/cs_active.cc"
                 ,0x158,&local_690);
      __cxa_throw(pvVar12,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    local_8d8._16_4_ = 0x61646c;
    local_8d8._8_8_ = (pointer)0x3;
    local_8d8._0_8_ = pp_Var2;
    iVar5 = (*local_be8->_vptr_options_i[1])();
    if ((_func_int **)local_8d8._0_8_ != pp_Var2) {
      operator_delete((void *)local_8d8._0_8_);
    }
    if ((char)iVar5 != '\0') {
      std::__cxx11::stringstream::stringstream((stringstream *)local_8d8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_8d8 + 0x10),"error: you can\'t combine lda and active learning",
                 0x30);
      pvVar12 = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (pvVar12,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/cs_active.cc"
                 ,0x15b,&local_6b0);
      __cxa_throw(pvVar12,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    local_8d8._8_8_ = (pointer)0x6;
    local_8d8._16_7_ = 0x657669746361;
    local_8d8._0_8_ = pp_Var2;
    iVar5 = (*local_be8->_vptr_options_i[1])();
    if ((_func_int **)local_8d8._0_8_ != pp_Var2) {
      operator_delete((void *)local_8d8._0_8_);
    }
    if ((char)iVar5 != '\0') {
      std::__cxx11::stringstream::stringstream((stringstream *)local_8d8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_8d8 + 0x10),
                 "error: you can\'t use --cs_active and --active at the same time",0x3e);
      pvVar12 = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (pvVar12,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/cs_active.cc"
                 ,0x15e,&local_6d0);
      __cxa_throw(pvVar12,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    local_8d8._16_8_ = 0x635f657669746361;
    local_8c0._M_allocated_capacity._0_4_ = 0x7265766f;
    local_8d8._8_8_ = (pointer)0xc;
    local_8c0._M_local_buf[4] = '\0';
    local_8d8._0_8_ = pp_Var2;
    iVar5 = (*local_be8->_vptr_options_i[1])();
    if ((_func_int **)local_8d8._0_8_ != pp_Var2) {
      operator_delete((void *)local_8d8._0_8_);
    }
    if ((char)iVar5 != '\0') {
      std::__cxx11::stringstream::stringstream((stringstream *)local_8d8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_8d8 + 0x10),
                 "error: you can\'t use --cs_active and --active_cover at the same time",0x44);
      pvVar12 = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (pvVar12,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/cs_active.cc"
                 ,0x161,&local_6f0);
      __cxa_throw(pvVar12,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    local_8d8._16_6_ = 0x61616f7363;
    local_8d8._8_8_ = (pointer)0x5;
    local_8d8._0_8_ = pp_Var2;
    iVar5 = (*local_be8->_vptr_options_i[1])();
    if ((_func_int **)local_8d8._0_8_ != pp_Var2) {
      operator_delete((void *)local_8d8._0_8_);
    }
    if ((char)iVar5 != '\0') {
      std::__cxx11::stringstream::stringstream((stringstream *)local_8d8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_8d8 + 0x10),
                 "error: you can\'t use --cs_active and --csoaa at the same time",0x3d);
      pvVar12 = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (pvVar12,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/cs_active.cc"
                 ,0x164,&local_710);
      __cxa_throw(pvVar12,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    local_8d8._8_8_ = (pointer)0x4;
    local_8d8._16_5_ = 0x78616461;
    local_8d8._0_8_ = pp_Var2;
    iVar5 = (*local_be8->_vptr_options_i[1])();
    if ((_func_int **)local_8d8._0_8_ != pp_Var2) {
      operator_delete((void *)local_8d8._0_8_);
    }
    pfVar4 = local_bb0;
    if ((char)iVar5 == '\0') {
      pvVar1 = &all_00->trace_message;
      std::__ostream_insert<char,std::char_traits<char>>
                (&pvVar1->super_ostream,"WARNING: --cs_active should be used with --adax",0x2f);
      std::ios::widen((char)(pvVar1->super_ostream)._vptr_basic_ostream[-3] + (char)pvVar1);
      std::ostream::put((char)pvVar1);
      std::ostream::flush();
    }
    ppuVar15 = &COST_SENSITIVE::cs_label;
    plVar16 = &all_00->p->lp;
    for (lVar13 = 9; lVar13 != 0; lVar13 = lVar13 + -1) {
      plVar16->default_label = (_func_void_void_ptr *)*ppuVar15;
      ppuVar15 = ppuVar15 + (ulong)bVar17 * -2 + 1;
      plVar16 = (label_parser *)((long)plVar16 + (ulong)bVar17 * -0x10 + 8);
    }
    (*all_00->set_minmax)(all_00->sd,*pfVar4);
    (*all_00->set_minmax)(all_00->sd,*local_ba8);
    if (*location != 0xffffffff) {
      uVar14 = 0;
      do {
        local_8d8._0_8_ = (_func_int **)0x0;
        v_array<unsigned_long>::push_back(&pcVar6->examples_by_queries,(unsigned_long *)local_8d8);
        uVar14 = uVar14 + 1;
      } while (uVar14 < *location + 1);
    }
    if (local_be9 == false) {
      pbVar10 = setup_base(local_be8,all_00);
      base = LEARNER::as_singleline<char,char>(pbVar10);
      predict = predict_or_learn<false,false>;
      learn = predict_or_learn<true,false>;
    }
    else {
      pbVar10 = setup_base(local_be8,all_00);
      base = LEARNER::as_singleline<char,char>(pbVar10);
      predict = predict_or_learn<false,true>;
      learn = predict_or_learn<true,true>;
    }
    plVar11 = LEARNER::learner<cs_active,example>::init_learner<LEARNER::learner<char,example>>
                        (local_be0,base,learn,predict,(ulong)local_be0->num_classes,multilabels);
    *(undefined8 *)(plVar11 + 0x58) = *(undefined8 *)(plVar11 + 0x18);
    *(code **)(plVar11 + 0x68) = finish_example;
    *(undefined8 *)(plVar11 + 0xb8) = *(undefined8 *)(plVar11 + 0x18);
    *(undefined8 *)(plVar11 + 0xc0) = *(undefined8 *)(plVar11 + 0x20);
    *(code **)(plVar11 + 200) = finish;
    all_00->cost_sensitive = (base_learner *)plVar11;
    if ((undefined1 *)local_670._0_8_ != local_670 + 0x10) {
      operator_delete((void *)local_670._0_8_);
    }
    local_be0 = (cs_active *)0x0;
  }
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_a50.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a50.m_name._M_dataplus._M_p != &local_a50.m_name.field_2) {
    operator_delete(local_a50.m_name._M_dataplus._M_p);
  }
  if (local_be0 != (cs_active *)0x0) {
    free(local_be0);
  }
  return (base_learner *)plVar11;
}

Assistant:

base_learner* cs_active_setup(options_i& options, vw& all)
{
  auto data = scoped_calloc_or_throw<cs_active>();

  bool simulation = false;
  int domination;
  option_group_definition new_options("Cost-sensitive Active Learning");
  new_options
      .add(make_option("cs_active", data->num_classes).keep().help("Cost-sensitive active learning with <k> costs"))
      .add(make_option("simulation", simulation).help("cost-sensitive active learning simulation mode"))
      .add(make_option("baseline", data->is_baseline).help("cost-sensitive active learning baseline"))
      .add(make_option("domination", domination)
               .default_value(1)
               .help("cost-sensitive active learning use domination. Default 1"))
      .add(make_option("mellowness", data->c0).default_value(0.1f).help("mellowness parameter c_0. Default 0.1."))
      .add(make_option("range_c", data->c1)
               .default_value(0.5f)
               .help("parameter controlling the threshold for per-label cost uncertainty. Default 0.5."))
      .add(make_option("max_labels", data->max_labels).default_value(-1).help("maximum number of label queries."))
      .add(make_option("min_labels", data->min_labels).default_value(-1).help("minimum number of label queries."))
      .add(make_option("cost_max", data->cost_max).default_value(1.f).help("cost upper bound. Default 1."))
      .add(make_option("cost_min", data->cost_min).default_value(0.f).help("cost lower bound. Default 0."))
      // TODO replace with trace and quiet
      .add(make_option("csa_debug", data->print_debug_stuff).help("print debug stuff for cs_active"));
  options.add_and_parse(new_options);

  data->use_domination = true;
  if (options.was_supplied("domination") && !domination)
    data->use_domination = false;

  if (!options.was_supplied("cs_active"))
    return nullptr;

  data->all = &all;
  data->t = 1;

  auto loss_function_type = all.loss->getType();
  if (loss_function_type != "squared")
    THROW("error: you can't use non-squared loss with cs_active");

  if (options.was_supplied("lda"))
    THROW("error: you can't combine lda and active learning");

  if (options.was_supplied("active"))
    THROW("error: you can't use --cs_active and --active at the same time");

  if (options.was_supplied("active_cover"))
    THROW("error: you can't use --cs_active and --active_cover at the same time");

  if (options.was_supplied("csoaa"))
    THROW("error: you can't use --cs_active and --csoaa at the same time");

  if (!options.was_supplied("adax"))
    all.trace_message << "WARNING: --cs_active should be used with --adax" << endl;

  all.p->lp = cs_label;  // assigning the label parser
  all.set_minmax(all.sd, data->cost_max);
  all.set_minmax(all.sd, data->cost_min);
  for (uint32_t i = 0; i < data->num_classes + 1; i++) data->examples_by_queries.push_back(0);

  learner<cs_active, example>& l = simulation
      ? init_learner(data, as_singleline(setup_base(options, all)), predict_or_learn<true, true>,
            predict_or_learn<false, true>, data->num_classes, prediction_type::multilabels)
      : init_learner(data, as_singleline(setup_base(options, all)), predict_or_learn<true, false>,
            predict_or_learn<false, false>, data->num_classes, prediction_type::multilabels);

  l.set_finish_example(finish_example);
  l.set_finish(finish);
  base_learner* b = make_base(l);
  all.cost_sensitive = b;
  return b;
}